

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_convert_a_&,_const_convert_a_&> * __thiscall
Catch::ExprLhs<C_A_T_C_H_T_E_S_T_0()::convert_a_const&>::operator==
          (BinaryExpr<const_convert_a_&,_const_convert_a_&> *__return_storage_ptr__,
          ExprLhs<C_A_T_C_H_T_E_S_T_0()::convert_a_const&> *this,convert_a *rhs)

{
  int iVar1;
  int iVar2;
  convert_a *pcVar3;
  StringRef local_40;
  
  pcVar3 = *(convert_a **)this;
  iVar1 = (pcVar3->super_type).super_strong_typedef<type,_int>.value_;
  iVar2 = (rhs->super_type).super_strong_typedef<type,_int>.value_;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = iVar1 == iVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021e5d0;
  __return_storage_ptr__->m_lhs = pcVar3;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }